

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFIter.cpp
# Opt level: O0

Box * __thiscall amrex::MFIter::tilebox(MFIter *this)

{
  int iVar1;
  Box *pBVar2;
  IntVect *pIVar3;
  byte bVar4;
  long in_RSI;
  MFIter *in_RDI;
  Box *bx;
  int d;
  IntVect *Big;
  Box *vbx;
  int off;
  uint bitval;
  uint typ;
  int dir;
  size_type in_stack_fffffffffffffeb8;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *in_stack_fffffffffffffec0;
  MFIter *this_00;
  int local_114;
  Box local_104;
  Box *local_e8;
  uint local_dc;
  int *local_d0;
  int local_c8;
  uint local_c4;
  uint local_c0;
  int local_bc;
  uint local_b0;
  int local_ac;
  uint *local_a8;
  int local_9c;
  IntVect *local_98;
  int local_8c;
  int *local_88;
  int local_7c;
  uint *local_78;
  int local_70;
  int local_6c;
  undefined1 *local_68;
  uint local_60;
  int local_5c;
  int *local_58;
  int local_4c;
  uint *local_48;
  int local_3c;
  int *local_38;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int *local_20;
  int local_18;
  int local_14;
  int *local_10;
  int local_4;
  
  this_00 = in_RDI;
  pBVar2 = Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                     (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  *(undefined8 *)((IntVect *)&in_RDI->m_fa)->vect = *(undefined8 *)(pBVar2->smallend).vect;
  in_RDI->fabArray = *(FabArrayBase **)((pBVar2->smallend).vect + 2);
  *(undefined8 *)(in_RDI->tile_size).vect = *(undefined8 *)((pBVar2->bigend).vect + 1);
  (in_RDI->tile_size).vect[2] = (pBVar2->btype).itype;
  local_d0 = (int *)(in_RSI + 0x30);
  if (*local_d0 != 0) {
    local_dc = *(uint *)(in_RSI + 0x30);
    for (local_bc = 0; local_bc < 3; local_bc = local_bc + 1) {
      local_78 = &local_b0;
      local_7c = local_bc;
      local_4c = local_bc;
      local_2c = local_bc;
      bVar4 = (byte)local_bc;
      local_c0 = (uint)((local_dc & 1 << (bVar4 & 0x1f)) != 0);
      local_88 = (in_RDI->tile_size).vect + 2;
      local_8c = local_bc;
      local_3c = local_bc;
      local_30 = local_bc;
      local_c4 = (uint)((*local_88 & 1 << (bVar4 & 0x1f)) != 0);
      local_c8 = local_c0 - local_c4;
      local_68 = (undefined1 *)((long)&in_RDI->fabArray + 4);
      local_6c = local_bc;
      *(int *)(local_68 + (long)local_bc * 4) = local_c8 + *(int *)(local_68 + (long)local_bc * 4);
      local_58 = (in_RDI->tile_size).vect + 2;
      local_5c = local_bc;
      if (local_c0 == 0) {
        local_24 = local_bc;
        local_18 = local_bc;
        *local_58 = (1 << (bVar4 & 0x1f) ^ 0xffffffffU) & *local_58;
        local_20 = local_58;
      }
      else {
        local_14 = local_bc;
        local_4 = local_bc;
        *local_58 = 1 << (bVar4 & 0x1f) | *local_58;
        local_10 = local_58;
      }
      local_70 = local_c8;
      local_60 = local_c0;
      local_48 = local_78;
      local_38 = local_88;
    }
    local_b0 = local_dc;
    validbox(this_00);
    local_e8 = &local_104;
    pIVar3 = Box::bigEnd(local_e8);
    for (local_114 = 0; local_114 < 3; local_114 = local_114 + 1) {
      local_a8 = (uint *)(in_RSI + 0x30);
      local_ac = local_114;
      local_28 = local_114;
      if ((*local_a8 & 1 << ((byte)local_114 & 0x1f)) != 0) {
        iVar1 = Box::bigEnd((Box *)in_RDI,local_114);
        local_9c = local_114;
        local_98 = pIVar3;
        if (iVar1 < pIVar3->vect[local_114]) {
          Box::growHi((Box *)in_RDI,local_114,-1);
        }
      }
    }
  }
  return (Box *)this_00;
}

Assistant:

Box
MFIter::tilebox () const noexcept
{
    BL_ASSERT(tile_array != 0);
    Box bx((*tile_array)[currentIndex]);
    if (! typ.cellCentered())
    {
        bx.convert(typ);
        const Box& vbx = validbox();
        const IntVect& Big = vbx.bigEnd();
        for (int d=0; d<AMREX_SPACEDIM; ++d) {
            if (typ.nodeCentered(d)) { // validbox should also be nodal in d-direction.
                if (bx.bigEnd(d) < Big[d]) {
                    bx.growHi(d,-1);
                }
            }
        }
    }
    return bx;
}